

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizardPrivate::updatePixmap(QWizardPrivate *this,WizardPixmap which)

{
  long lVar1;
  QVBoxLayout *pQVar2;
  QWizardHeader *this_00;
  QLabel *pQVar3;
  bool bVar4;
  undefined4 uVar5;
  QWidget *pQVar6;
  QLayout *pQVar7;
  long *plVar8;
  ulong uVar9;
  QSpacerItem *this_01;
  long lVar10;
  Policy vPolicy;
  WizardPixmap which_00;
  long in_FS_OFFSET;
  QPixmap aQStack_e8 [24];
  undefined1 auStack_d0 [16];
  undefined1 *puStack_c0;
  QString QStack_b8;
  QString QStack_98;
  undefined1 *puStack_78;
  undefined1 *puStack_70;
  undefined1 *puStack_68;
  undefined1 *puStack_60;
  undefined1 *puStack_58;
  undefined1 *puStack_50;
  undefined8 uStack_48;
  long lStack_38;
  
  if (which == BackgroundPixmap) {
    if (this->wizStyle != MacStyle) {
      return;
    }
    pQVar6 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    QWidget::update(pQVar6);
    QWidget::updateGeometry(pQVar6);
    return;
  }
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  disableUpdates(this);
  uStack_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  layoutInfoForCurrentPage((QWizardLayoutInfo *)&puStack_78,this);
  bVar4 = QWizardLayoutInfo::operator==(&this->layoutInfo,(QWizardLayoutInfo *)&puStack_78);
  if (!bVar4) {
    recreateLayout(this,(QWizardLayoutInfo *)&puStack_78);
  }
  lVar10 = *(long *)(lVar1 + 8);
  QStack_b8.d.d = (Data *)CONCAT44(QStack_b8.d.d._4_4_,*(undefined4 *)(lVar10 + 0x340));
  QStack_98.d.d = (Data *)0x0;
  pQVar6 = &QMap<int,_QWizardPage_*>::value
                      ((QMap<int,_QWizardPage_*> *)(lVar10 + 0x2e0),(int *)&QStack_b8,
                       (QWizardPage **)&QStack_98)->super_QWidget;
  if (pQVar6 != (QWidget *)0x0) {
    pQVar7 = QWidget::layout(pQVar6);
    if (pQVar7 == (QLayout *)0x0) {
      vPolicy = Ignored;
    }
    else {
      pQVar2 = this->pageVBoxLayout;
      uVar5 = (**(code **)(*(long *)&(pQVar2->super_QBoxLayout).super_QLayout + 0xb8))
                        (pQVar2,pQVar6);
      plVar8 = (long *)(**(code **)(*(long *)&(pQVar2->super_QBoxLayout).super_QLayout + 0xa8))
                                 (pQVar2,uVar5);
      uVar9 = (**(code **)(*plVar8 + 0x28))(plVar8);
      vPolicy = Ignored;
      if ((uVar9 & 2) == 0) {
        vPolicy = MinimumExpanding;
      }
    }
    pQVar2 = this->pageVBoxLayout;
    (**(code **)(*(long *)&(pQVar2->super_QBoxLayout).super_QLayout + 200))(pQVar2);
    plVar8 = (long *)(**(code **)(*(long *)&(pQVar2->super_QBoxLayout).super_QLayout + 0xa8))
                               (pQVar2);
    this_01 = (QSpacerItem *)(**(code **)(*plVar8 + 0x78))(plVar8);
    QSpacerItem::changeSize(this_01,0,0,Ignored,vPolicy);
    (**(code **)(*(long *)&(this->pageVBoxLayout->super_QBoxLayout).super_QLayout + 0x70))();
  }
  which_00 = (WizardPixmap)pQVar6;
  if (uStack_48._0_1_ == true) {
    this_00 = this->headerWidget;
    lVar10 = *(long *)&pQVar6->field_0x8;
    QStack_98.d.d = *(Data **)(lVar10 + 0x260);
    QStack_98.d.ptr = *(char16_t **)(lVar10 + 0x268);
    QStack_98.d.size = *(undefined8 *)(lVar10 + 0x270);
    if (&(QStack_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      lVar10 = *(long *)&pQVar6->field_0x8;
    }
    QStack_b8.d.d = *(Data **)(lVar10 + 0x278);
    QStack_b8.d.ptr = *(char16_t **)(lVar10 + 0x280);
    QStack_b8.d.size = *(undefined8 *)(lVar10 + 0x288);
    if (&(QStack_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QWizardPage::pixmap((QWizardPage *)auStack_d0,which_00);
    QWizardPage::pixmap((QWizardPage *)aQStack_e8,which_00);
    QWizardHeader::setup
              (this_00,(QWizardLayoutInfo *)&puStack_78,&QStack_98,&QStack_b8,(QPixmap *)auStack_d0,
               aQStack_e8,this->titleFmt,this->subTitleFmt);
    QPixmap::~QPixmap(aQStack_e8);
    QPixmap::~QPixmap((QPixmap *)auStack_d0);
    if (&(QStack_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(QStack_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(QStack_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(QStack_98.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  bVar4 = uStack_48._1_1_;
  if ((uStack_48._1_1_ != false) || (uStack_48._5_1_ == true)) {
    QStack_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QStack_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QStack_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)&QStack_b8);
    if (bVar4 != false) {
      if (pQVar6 == (QWidget *)0x0) {
        QPixmap::QPixmap((QPixmap *)auStack_d0,(QPixmap *)(*(long *)(lVar1 + 8) + 0x3c0));
      }
      else {
        QWizardPage::pixmap((QWizardPage *)auStack_d0,which_00);
      }
      QStack_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QStack_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QStack_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QPaintDevice::QPaintDevice((QPaintDevice *)&QStack_98);
      QStack_98.d.size = QStack_b8.d.size;
      QStack_b8.d.size = (qsizetype)puStack_c0;
      QStack_98.d.d = (Data *)QDataStream::operator<<;
      puStack_c0 = (undefined1 *)0x0;
      QPixmap::~QPixmap((QPixmap *)&QStack_98);
      QPixmap::~QPixmap((QPixmap *)auStack_d0);
    }
    QLabel::setPixmap(&this->watermarkLabel->super_QLabel,(QPixmap *)&QStack_b8);
    QPixmap::~QPixmap((QPixmap *)&QStack_b8);
  }
  if (uStack_48._2_1_ == true) {
    QLabel::setTextFormat(this->titleLabel,this->titleFmt);
    pQVar3 = this->titleLabel;
    lVar1 = *(long *)&pQVar6->field_0x8;
    QStack_98.d.d = *(Data **)(lVar1 + 0x260);
    QStack_98.d.ptr = *(char16_t **)(lVar1 + 0x268);
    QStack_98.d.size = *(undefined8 *)(lVar1 + 0x270);
    if (&(QStack_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QLabel::setText(pQVar3,&QStack_98);
    if (&(QStack_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(QStack_98.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (uStack_48._3_1_ == true) {
    QLabel::setTextFormat(this->subTitleLabel,this->subTitleFmt);
    pQVar3 = this->subTitleLabel;
    lVar1 = *(long *)&pQVar6->field_0x8;
    QStack_98.d.d = *(Data **)(lVar1 + 0x278);
    QStack_98.d.ptr = *(char16_t **)(lVar1 + 0x280);
    QStack_98.d.size = *(undefined8 *)(lVar1 + 0x288);
    if (&(QStack_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QLabel::setText(pQVar3,&QStack_98);
    if (&(QStack_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(QStack_98.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  enableUpdates(this);
  updateMinMaxSizes(this,(QWizardLayoutInfo *)&puStack_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizardPrivate::updatePixmap(QWizard::WizardPixmap which)
{
    Q_Q(QWizard);
    if (which == QWizard::BackgroundPixmap) {
        if (wizStyle == QWizard::MacStyle) {
            q->update();
            q->updateGeometry();
        }
    } else {
        updateLayout();
    }
}